

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

node * list_insert_before(list *list,node *node,void *data)

{
  list *plVar1;
  node *pnVar2;
  list *plVar3;
  
  pnVar2 = (node *)malloc(0x18);
  if (pnVar2 == (node *)0x0) {
    pnVar2 = (node *)0x0;
  }
  else {
    pnVar2->next = (node *)0x0;
    pnVar2->previous = (node *)0x0;
    pnVar2->data = data;
  }
  if (pnVar2 == (node *)0x0 || (node == (node *)0x0 || list == (list *)0x0)) {
    pnVar2 = (node *)0x0;
  }
  else {
    pnVar2->next = node;
    plVar1 = (list *)node->previous;
    plVar3 = list;
    if (plVar1 != (list *)0x0) {
      pnVar2->previous = node;
      plVar3 = plVar1;
    }
    plVar3->head = pnVar2;
    node->previous = pnVar2;
    list->size = list->size + 1;
  }
  return pnVar2;
}

Assistant:

struct node *list_insert_before(struct list *list, struct node *node, const void *data)
{
        return list_insert_node_before(list, node, node_create(data));
}